

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O0

void __thiscall Rml::DecoratorTextInstancer::DecoratorTextInstancer(DecoratorTextInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_3e1;
  String local_3e0;
  allocator<char> local_3b9;
  String local_3b8;
  allocator<char> local_391;
  String local_390;
  allocator<char> local_369;
  String local_368;
  allocator<char> local_341;
  String local_340;
  allocator<char> local_319;
  String local_318;
  allocator<char> local_2f1;
  String local_2f0;
  allocator<char> local_2c9;
  String local_2c8;
  allocator<char> local_2a1;
  String local_2a0;
  allocator<char> local_279;
  String local_278;
  allocator<char> local_251;
  String local_250;
  allocator<char> local_229;
  String local_228;
  allocator<char> local_201;
  String local_200;
  allocator<char> local_1d9;
  String local_1d8;
  allocator<char> local_1b1;
  String local_1b0;
  allocator<char> local_189;
  String local_188;
  allocator<char> local_161;
  String local_160;
  allocator<char> local_139;
  String local_138;
  allocator<char> local_111;
  String local_110;
  allocator<char> local_e9;
  String local_e8;
  allocator<char> local_c1;
  String local_c0;
  allocator<char> local_99;
  String local_98;
  allocator<char> local_71;
  String local_70;
  allocator<char> local_39;
  String local_38;
  undefined4 local_14;
  DecoratorTextInstancer *local_10;
  DecoratorTextInstancer *this_local;
  
  local_10 = this;
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTextInstancer_00815f10;
  local_14 = 0;
  (this->ids).text = Invalid;
  (this->ids).color = Invalid;
  (this->ids).align_x = Invalid;
  (this->ids).align_y = Invalid;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"text",&local_39);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_38,
                      &local_70);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"string",&local_99);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_98,&local_c0);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).text = PVar1;
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::allocator<char>::~allocator(&local_c1);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::allocator<char>::~allocator(&local_99);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::allocator<char>::~allocator(&local_71);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"color",&local_e9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"inherit-color",&local_111);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_e8,
                      &local_110);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"keyword",&local_139);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"inherit-color",&local_161);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_138,&local_160);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"color",&local_189);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_188,&local_1b0);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_1b0);
  ::std::allocator<char>::~allocator(&local_1b1);
  ::std::__cxx11::string::~string((string *)&local_188);
  ::std::allocator<char>::~allocator(&local_189);
  ::std::__cxx11::string::~string((string *)&local_160);
  ::std::allocator<char>::~allocator(&local_161);
  ::std::__cxx11::string::~string((string *)&local_138);
  ::std::allocator<char>::~allocator(&local_139);
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::allocator<char>::~allocator(&local_111);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::allocator<char>::~allocator(&local_e9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"align-x",&local_1d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"center",&local_201);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_1d8,
                      &local_200);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"keyword",&local_229);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"left, center, right",&local_251);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_228,&local_250);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"length_percent",&local_279);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_278,&local_2a0);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).align_x = PVar1;
  ::std::__cxx11::string::~string((string *)&local_2a0);
  ::std::allocator<char>::~allocator(&local_2a1);
  ::std::__cxx11::string::~string((string *)&local_278);
  ::std::allocator<char>::~allocator(&local_279);
  ::std::__cxx11::string::~string((string *)&local_250);
  ::std::allocator<char>::~allocator(&local_251);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::allocator<char>::~allocator(&local_229);
  ::std::__cxx11::string::~string((string *)&local_200);
  ::std::allocator<char>::~allocator(&local_201);
  ::std::__cxx11::string::~string((string *)&local_1d8);
  ::std::allocator<char>::~allocator(&local_1d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"align-y",&local_2c9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"center",&local_2f1);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_2c8,
                      &local_2f0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"keyword",&local_319);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"top, center, bottom",&local_341);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_318,&local_340);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"length_percent",&local_369);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"",&local_391);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_368,&local_390);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).align_y = PVar1;
  ::std::__cxx11::string::~string((string *)&local_390);
  ::std::allocator<char>::~allocator(&local_391);
  ::std::__cxx11::string::~string((string *)&local_368);
  ::std::allocator<char>::~allocator(&local_369);
  ::std::__cxx11::string::~string((string *)&local_340);
  ::std::allocator<char>::~allocator(&local_341);
  ::std::__cxx11::string::~string((string *)&local_318);
  ::std::allocator<char>::~allocator(&local_319);
  ::std::__cxx11::string::~string((string *)&local_2f0);
  ::std::allocator<char>::~allocator(&local_2f1);
  ::std::__cxx11::string::~string((string *)&local_2c8);
  ::std::allocator<char>::~allocator(&local_2c9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"decorator",&local_3b9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"text, color, align-x, align-y, align-x",&local_3e1);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_3b8,&local_3e0,
             FallThrough);
  ::std::__cxx11::string::~string((string *)&local_3e0);
  ::std::allocator<char>::~allocator(&local_3e1);
  ::std::__cxx11::string::~string((string *)&local_3b8);
  ::std::allocator<char>::~allocator(&local_3b9);
  return;
}

Assistant:

DecoratorTextInstancer::DecoratorTextInstancer()
{
	ids = {};
	ids.text = RegisterProperty("text", "").AddParser("string").GetId();
	ids.color = RegisterProperty("color", "inherit-color").AddParser("keyword", "inherit-color").AddParser("color").GetId();
	ids.align_x = RegisterProperty("align-x", "center").AddParser("keyword", "left, center, right").AddParser("length_percent").GetId();
	ids.align_y = RegisterProperty("align-y", "center").AddParser("keyword", "top, center, bottom").AddParser("length_percent").GetId();

	RegisterShorthand("decorator", "text, color, align-x, align-y, align-x", ShorthandType::FallThrough);
}